

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler *
llama_sampler_init_mirostat(int32_t n_vocab,uint32_t seed,float tau,float eta,int32_t m)

{
  uint32_t uVar1;
  int32_t *piVar2;
  long lVar3;
  llama_sampler *plVar4;
  ulong uVar5;
  
  uVar1 = get_rng_seed(seed);
  piVar2 = (int32_t *)operator_new(0x13a8);
  *piVar2 = n_vocab;
  piVar2[1] = seed;
  piVar2[2] = uVar1;
  piVar2[3] = (int32_t)tau;
  piVar2[4] = (int32_t)eta;
  piVar2[5] = m;
  piVar2[6] = (int32_t)(tau + tau);
  uVar5 = (ulong)uVar1;
  *(ulong *)(piVar2 + 8) = uVar5;
  lVar3 = 5;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3) - 4);
    *(ulong *)(piVar2 + lVar3 * 2) = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x274);
  piVar2[0x4e8] = 0x270;
  piVar2[0x4e9] = 0;
  plVar4 = (llama_sampler *)operator_new(0x10);
  plVar4->iface = &llama_sampler_mirostat_i;
  plVar4->ctx = piVar2;
  return plVar4;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat(int32_t n_vocab, uint32_t seed, float tau, float eta, int32_t m) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_i,
        /* .ctx   = */ new llama_sampler_mirostat {
            /* .n_vocab  = */ n_vocab,
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .m        = */ m,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}